

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiSettingsHandler * ImGui::FindSettingsHandler(char *type_name)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *pIVar3;
  long lVar4;
  
  pIVar1 = GImGui;
  IVar2 = ImHashStr(type_name,0,0);
  lVar4 = (long)(pIVar1->SettingsHandlers).Size;
  if (lVar4 != 0) {
    pIVar3 = (pIVar1->SettingsHandlers).Data;
    lVar4 = lVar4 * 0x48;
    do {
      if (pIVar3->TypeHash == IVar2) {
        return pIVar3;
      }
      pIVar3 = pIVar3 + 1;
      lVar4 = lVar4 + -0x48;
    } while (lVar4 != 0);
  }
  return (ImGuiSettingsHandler *)0x0;
}

Assistant:

ImGuiSettingsHandler* ImGui::FindSettingsHandler(const char* type_name)
{
    ImGuiContext& g = *GImGui;
    const ImGuiID type_hash = ImHashStr(type_name);
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.TypeHash == type_hash)
            return &handler;
    return NULL;
}